

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  long lVar37;
  __m128i_64_t B;
  ulong uVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar42;
  long lVar43;
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar50;
  ulong uVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i_64_t B_4;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar56;
  int64_t iVar58;
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i_64_t B_3;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  __m128i_64_t B_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128i vNWS;
  __m128i vNWL;
  long local_300;
  long local_2f8;
  undefined1 local_2b8 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_238 [16];
  ulong uStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  ulong uStack_1e0;
  int64_t local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  long lStack_140;
  ulong uStack_130;
  long lStack_100;
  ulong uStack_f0;
  long local_98;
  long lStack_90;
  long lVar15;
  ulong uVar20;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_table_diag_sse41_128_64_cold_8();
  }
  else {
    uVar20 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_nw_stats_table_diag_sse41_128_64_cold_7();
    }
    else if (open < 0) {
      parasail_nw_stats_table_diag_sse41_128_64_cold_6();
    }
    else if (gap < 0) {
      parasail_nw_stats_table_diag_sse41_128_64_cold_5();
    }
    else {
      uVar27 = (ulong)(uint)_s1Len;
      if (matrix == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_diag_sse41_128_64_cold_4();
      }
      else {
        if (matrix->type == 1) {
          if (_s1 == (char *)0x0) {
            parasail_nw_stats_table_diag_sse41_128_64_cold_3();
            return (parasail_result_t *)0x0;
          }
        }
        else {
          if (_s1 == (char *)0x0) {
            parasail_nw_stats_table_diag_sse41_128_64_cold_2();
            return (parasail_result_t *)0x0;
          }
          if (_s1Len < 1) {
            parasail_nw_stats_table_diag_sse41_128_64_cold_1();
            return (parasail_result_t *)0x0;
          }
        }
        if (matrix->type != 0) {
          uVar27 = (ulong)(uint)matrix->length;
        }
        iVar10 = matrix->min;
        iVar21 = -open;
        uVar34 = 0x8000000000000000 - (long)iVar10;
        if (iVar10 != iVar21 && SBORROW4(iVar10,iVar21) == iVar10 + open < 0) {
          uVar34 = (ulong)(uint)open | 0x8000000000000000;
        }
        iVar10 = matrix->max;
        iVar28 = (int)uVar27;
        ppVar11 = parasail_result_new_table3(iVar28,s2Len);
        if (ppVar11 != (parasail_result_t *)0x0) {
          ppVar11->flag = ppVar11->flag | 0x2831001;
          ptr = parasail_memalign_int64_t(0x10,(long)(iVar28 + 1));
          uVar17 = (ulong)(s2Len + 2);
          ptr_00 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_01 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_02 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_03 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_04 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_05 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_06 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_07 = parasail_memalign_int64_t(0x10,uVar17);
          ptr_08 = parasail_memalign_int64_t(0x10,uVar17);
          if ((ptr_08 != (int64_t *)0x0 &&
              (ptr_07 != (int64_t *)0x0 && (ptr_06 != (int64_t *)0x0 && ptr_05 != (int64_t *)0x0)))
              && ((ptr_04 != (int64_t *)0x0 &&
                  (ptr_03 != (int64_t *)0x0 && ptr_02 != (int64_t *)0x0)) &&
                 ((ptr_01 != (int64_t *)0x0 && ptr_00 != (int64_t *)0x0) && ptr != (int64_t *)0x0)))
          {
            uVar17 = uVar34 + 1;
            lVar12 = 0x7ffffffffffffffe - (long)iVar10;
            lVar1 = (long)iVar28 + -1;
            uVar13 = uVar20 - 1;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar13;
            lVar16 = (long)iVar21;
            if (0 < iVar28) {
              piVar3 = matrix->mapper;
              uVar22 = 0;
              do {
                ptr[uVar22] = (long)piVar3[(byte)_s1[uVar22]];
                uVar22 = uVar22 + 1;
              } while (uVar27 != uVar22);
            }
            uVar9 = iVar28 - 1;
            iVar10 = s2Len + -1;
            auVar63._8_4_ = (int)uVar17;
            auVar63._0_8_ = uVar17;
            auVar63._12_4_ = (int)(uVar17 >> 0x20);
            local_1b8._8_4_ = (int)lVar12;
            local_1b8._0_8_ = lVar12;
            local_1b8._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar45._8_4_ = (int)lVar1;
            auVar45._0_8_ = lVar1;
            auVar45._12_4_ = (int)((ulong)lVar1 >> 0x20);
            auVar46._8_4_ = (int)uVar13;
            auVar46._0_8_ = uVar13;
            auVar46._12_4_ = (int)(uVar13 >> 0x20);
            local_288._8_8_ = lVar16;
            local_288._0_8_ = (long)(iVar21 - gap);
            ptr[iVar28] = 0;
            piVar3 = matrix->mapper;
            uVar22 = 1;
            if (1 < s2Len) {
              uVar22 = uVar20;
            }
            uVar23 = 0;
            do {
              ptr_00[uVar23 + 1] = (long)piVar3[(byte)_s2[uVar23]];
              uVar23 = uVar23 + 1;
            } while (uVar22 != uVar23);
            *ptr_00 = 0;
            ptr_00[uVar20 + 1] = 0;
            uVar23 = (ulong)(uint)gap;
            lVar24 = 0;
            do {
              *(long *)((long)ptr_01 + lVar24 + 8) = lVar16;
              *(undefined8 *)((long)ptr_02 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_03 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_04 + lVar24 + 8) = 0;
              *(ulong *)((long)ptr_05 + lVar24 + 8) = uVar17;
              *(undefined8 *)((long)ptr_06 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_07 + lVar24 + 8) = 0;
              *(undefined8 *)((long)ptr_08 + lVar24 + 8) = 0;
              lVar16 = lVar16 - uVar23;
              lVar24 = lVar24 + 8;
            } while (uVar22 * 8 != lVar24);
            *ptr_01 = 0;
            *ptr_02 = 0;
            *ptr_03 = 0;
            *ptr_04 = 0;
            *ptr_05 = 0;
            *ptr_06 = 0;
            *ptr_07 = 0;
            *ptr_08 = 0;
            ptr_01[uVar20 + 1] = 0;
            ptr_02[uVar20 + 1] = 0;
            ptr_03[uVar20 + 1] = 0;
            ptr_04[uVar20 + 1] = 0;
            ptr_05[uVar20 + 1] = 0;
            ptr_06[uVar20 + 1] = 0;
            ptr_07[uVar20 + 1] = 0;
            ptr_08[uVar20 + 1] = 0;
            *ptr_01 = 0;
            auVar73 = auVar63;
            local_238 = auVar63;
            local_218 = auVar63;
            local_208 = auVar63;
            local_1f8 = auVar63;
            if (0 < iVar28) {
              piVar3 = matrix->matrix;
              local_300 = uVar20 * 4 + -4;
              auVar47 = pmovsxbq(local_288,1);
              local_2f8 = 0;
              uVar22 = 0;
              do {
                uVar56 = ptr[uVar22];
                uVar4 = ptr[uVar22 + 1];
                uVar29 = uVar9;
                if ((uVar22 | 1) < uVar27) {
                  uVar29 = (uint)uVar22 | 1;
                }
                bVar35 = matrix->type != 0;
                uVar25 = uVar56;
                if (bVar35) {
                  uVar25 = uVar22;
                }
                iVar28 = matrix->size;
                uVar30 = (long)(int)uVar29;
                if (!bVar35) {
                  uVar30 = uVar4;
                }
                uVar2 = uVar22 + 2;
                iVar58 = *ptr_01;
                *ptr_01 = (long)iVar21 - uVar2 * uVar23;
                auVar65._8_8_ = 0;
                auVar65._0_8_ = (long)iVar21 - uVar22 * uVar23;
                auVar65 = auVar65 << 0x40;
                uStack_1c0 = 0;
                auVar66 = (undefined1  [16])0x0;
                lStack_140 = auVar45._8_8_;
                lVar50 = auVar47._8_8_;
                uVar31 = 0;
                uStack_220 = auVar63._8_8_;
                local_268 = pmovsxbq(auVar60,0xff);
                auVar60 = (undefined1  [16])0x0;
                local_1e8 = 0;
                auVar52 = (undefined1  [16])0x0;
                local_278 = (undefined1  [16])0x0;
                auVar64 = (undefined1  [16])0x0;
                auVar59 = (undefined1  [16])0x0;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar17;
                local_2b8 = auVar70 << 0x40;
                auVar61 = (undefined1  [16])0x0;
                auVar72 = (undefined1  [16])0x0;
                auVar70 = ZEXT816(0);
                lVar16 = 0;
                lVar24 = 0;
                lVar14 = 0;
                lVar15 = 0;
                lVar44 = 0;
                uStack_1e0 = uVar17;
                do {
                  lVar42 = auVar65._8_8_;
                  lVar5 = ptr_01[uVar31 + 1];
                  auVar74._0_8_ = auVar72._8_8_;
                  iVar6 = ptr_02[uVar31 + 1];
                  auVar74._8_8_ = iVar6;
                  auVar71._0_8_ = auVar61._8_8_;
                  iVar7 = ptr_03[uVar31 + 1];
                  auVar71._8_8_ = iVar7;
                  auVar53._0_8_ = auVar52._8_8_;
                  auVar53._8_8_ = ptr_04[uVar31 + 1];
                  auVar62._0_8_ = auVar60._8_8_;
                  auVar62._8_8_ = ptr_06[uVar31 + 1];
                  auVar68._8_8_ = ptr_07[uVar31 + 1];
                  auVar68._0_8_ = uStack_1c0;
                  auVar67._0_8_ = auVar66._8_8_;
                  auVar67._8_8_ = ptr_08[uVar31 + 1];
                  lVar43 = lVar42 - (ulong)(uint)open;
                  uVar51 = lVar5 - (ulong)(uint)open;
                  uStack_f0 = (ulong)(uint)gap;
                  lVar37 = CONCAT44(local_1e8._4_4_,(undefined4)uStack_1e0) - (ulong)(uint)gap;
                  uVar41 = ptr_05[uVar31 + 1] - uStack_f0;
                  local_1e8 = lVar37;
                  if (lVar37 < lVar43) {
                    local_1e8 = lVar43;
                  }
                  uStack_1e0 = uVar41;
                  if ((long)uVar41 < (long)uVar51) {
                    uStack_1e0 = uVar51;
                  }
                  auVar38._8_8_ = -(ulong)((long)uVar41 < (long)uVar51);
                  auVar38._0_8_ = -(ulong)(lVar37 < lVar43);
                  auVar60 = pblendvb(auVar62,auVar74,auVar38);
                  auVar62 = pblendvb(auVar68,auVar71,auVar38);
                  auVar68 = pblendvb(auVar67,auVar53,auVar38);
                  lVar43 = auVar65._0_8_ - (ulong)(uint)open;
                  uVar41 = lVar42 - (ulong)(uint)open;
                  lVar37 = local_2b8._0_8_ - (ulong)(uint)gap;
                  uStack_f0 = local_2b8._8_8_ - uStack_f0;
                  local_2b8._0_8_ = lVar43;
                  if (lVar43 <= lVar37) {
                    local_2b8._0_8_ = lVar37;
                  }
                  local_2b8._8_8_ = uVar41;
                  if ((long)uVar41 <= (long)uStack_f0) {
                    local_2b8._8_8_ = uStack_f0;
                  }
                  auVar39._8_8_ = -(ulong)((long)uStack_f0 < (long)uVar41);
                  auVar39._0_8_ = -(ulong)(lVar37 < lVar43);
                  auVar59 = pblendvb(auVar59,auVar72,auVar39);
                  auVar64 = pblendvb(auVar64,auVar61,auVar39);
                  auVar65 = pblendvb(local_278,auVar52,auVar39);
                  uVar41 = ptr_00[uVar31 + 1];
                  lVar43 = (long)piVar3[uVar25 * (long)iVar28 + uVar41];
                  lVar19 = (long)piVar3[uVar30 * (long)iVar28 + ptr_00[uVar31]];
                  lVar44 = lVar19 + lVar44;
                  uVar51 = lVar43 + iVar58;
                  lVar37 = lVar44;
                  if (lVar44 <= (long)local_2b8._0_8_) {
                    lVar37 = local_2b8._0_8_;
                  }
                  auVar52._8_4_ = 0xffffffff;
                  auVar52._0_8_ = 0xffffffffffffffff;
                  auVar52._12_4_ = 0xffffffff;
                  auVar66._0_8_ = auVar68._0_8_ + 1;
                  auVar66._8_8_ = auVar68._8_8_ - auVar52._8_8_;
                  local_278._0_8_ = auVar65._0_8_ + 1;
                  local_278._8_8_ = auVar65._8_8_ - auVar52._8_8_;
                  uVar26 = uVar51;
                  if ((long)uVar51 <= (long)local_2b8._8_8_) {
                    uVar26 = local_2b8._8_8_;
                  }
                  if (lVar37 <= local_1e8) {
                    lVar37 = local_1e8;
                  }
                  uVar33 = uStack_1e0;
                  if ((long)uStack_1e0 < (long)uVar26) {
                    uVar33 = uVar26;
                  }
                  auVar69._8_8_ = uVar33;
                  auVar69._0_8_ = lVar37;
                  auVar54._0_8_ = -(ulong)(lVar37 == local_1e8);
                  auVar54._8_8_ = -(ulong)(uVar33 == uStack_1e0);
                  auVar65 = blendvpd(auVar59,auVar60,auVar54);
                  auVar48._0_8_ = -(ulong)(lVar44 == lVar37);
                  auVar48._8_8_ = -(ulong)(uVar51 == uVar33);
                  auVar72._0_8_ = lVar16 + (ulong)(uVar4 == uStack_220);
                  auVar72._8_8_ = lVar24 + (ulong)(uVar56 == uVar41);
                  auVar72 = blendvpd(auVar65,auVar72,auVar48);
                  auVar65 = blendvpd(auVar64,auVar62,auVar54);
                  auVar61._0_8_ = (ulong)(0 < lVar19) + lVar14;
                  auVar61._8_8_ = (ulong)(0 < lVar43) + lVar15;
                  auVar61 = blendvpd(auVar65,auVar61,auVar48);
                  auVar65 = blendvpd(local_278,auVar66,auVar54);
                  auVar55._8_4_ = 0xffffffff;
                  auVar55._0_8_ = 0xffffffffffffffff;
                  auVar55._12_4_ = 0xffffffff;
                  local_98 = auVar70._0_8_;
                  lStack_90 = auVar70._8_8_;
                  auVar57._0_8_ = local_98 + 1;
                  auVar57._8_8_ = lStack_90 - auVar55._8_8_;
                  auVar52 = blendvpd(auVar65,auVar57,auVar48);
                  auVar49._0_8_ = -(ulong)(local_268._0_8_ == 0xffffffffffffffff);
                  auVar49._8_8_ = -(ulong)(local_268._8_8_ == auVar55._8_8_);
                  auVar65 = blendvpd(auVar69,local_288,auVar49);
                  auVar72 = ~auVar49 & auVar72;
                  auVar61 = ~auVar49 & auVar61;
                  auVar52 = ~auVar49 & auVar52;
                  local_2b8 = blendvpd(local_2b8,auVar63,auVar49);
                  lVar16 = auVar65._8_8_;
                  lVar44 = auVar65._0_8_;
                  lVar24 = auVar72._0_8_;
                  lVar14 = auVar61._0_8_;
                  lVar15 = auVar52._0_8_;
                  if (1 < uVar31) {
                    if (lVar44 <= (long)local_1b8._0_8_) {
                      local_1b8._0_8_ = lVar44;
                    }
                    if (lVar16 <= (long)local_1b8._8_8_) {
                      local_1b8._8_8_ = lVar16;
                    }
                    lVar37 = lVar44;
                    if (lVar44 < (long)local_238._0_8_) {
                      lVar37 = local_238._0_8_;
                    }
                    if (lVar16 < (long)local_238._8_8_) {
                      lVar16 = local_238._8_8_;
                    }
                    if (lVar37 <= lVar24) {
                      lVar37 = lVar24;
                    }
                    if (lVar16 <= auVar72._8_8_) {
                      lVar16 = auVar72._8_8_;
                    }
                    if (lVar37 <= lVar14) {
                      lVar37 = lVar14;
                    }
                    if (lVar16 <= auVar61._8_8_) {
                      lVar16 = auVar61._8_8_;
                    }
                    if (lVar37 <= lVar15) {
                      lVar37 = lVar15;
                    }
                    if (lVar16 <= auVar52._8_8_) {
                      lVar16 = auVar52._8_8_;
                    }
                    local_238._8_8_ = lVar16;
                    local_238._0_8_ = lVar37;
                  }
                  lVar16 = *((ppVar11->field_4).trace)->trace_del_table;
                  if (uVar31 < uVar20) {
                    *(int *)(local_2f8 + lVar16 + uVar31 * 4) = auVar65._8_4_;
                  }
                  bVar35 = (uVar22 | 1) < uVar27;
                  bVar36 = uVar31 != 0;
                  if (bVar36 && bVar35) {
                    *(int *)(lVar16 + local_300 + uVar31 * 4) = auVar65._0_4_;
                  }
                  lVar16 = *(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 8);
                  if (uVar31 < uVar20) {
                    *(int *)(local_2f8 + lVar16 + uVar31 * 4) = auVar72._8_4_;
                  }
                  if (bVar36 && bVar35) {
                    *(int *)(lVar16 + local_300 + uVar31 * 4) = auVar72._0_4_;
                  }
                  lVar16 = *(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x10);
                  if (uVar31 < uVar20) {
                    *(int *)(local_2f8 + lVar16 + uVar31 * 4) = auVar61._8_4_;
                  }
                  if (bVar36 && bVar35) {
                    *(int *)(lVar16 + local_300 + uVar31 * 4) = auVar61._0_4_;
                  }
                  lVar16 = *(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x18);
                  if (uVar31 < uVar20) {
                    *(int *)(local_2f8 + lVar16 + uVar31 * 4) = auVar52._8_4_;
                  }
                  if (bVar36 && bVar35) {
                    *(int *)(lVar16 + local_300 + uVar31 * 4) = auVar52._0_4_;
                  }
                  auVar59 = ~auVar49 & auVar59;
                  auVar64 = ~auVar49 & auVar64;
                  lStack_100 = auVar46._8_8_;
                  auVar40._0_8_ = -(ulong)(local_268._0_8_ == uVar13);
                  auVar40._8_8_ = -(ulong)(local_268._8_8_ == lStack_100);
                  auVar8._8_8_ = -(ulong)(lVar50 == lStack_140);
                  auVar8._0_8_ = -(ulong)(auVar47._0_8_ == lVar1);
                  auVar40 = auVar40 & auVar8;
                  auVar73 = blendvpd(auVar73,auVar65,auVar40);
                  local_278 = ~auVar49 & local_278;
                  local_1f8 = blendvpd(local_1f8,auVar72,auVar40);
                  local_208 = blendvpd(local_208,auVar61,auVar40);
                  local_218 = blendvpd(local_218,auVar52,auVar40);
                  ptr_01[uVar31] = lVar44;
                  ptr_02[uVar31] = lVar24;
                  ptr_03[uVar31] = lVar14;
                  ptr_04[uVar31] = lVar15;
                  ptr_05[uVar31] = local_1e8;
                  ptr_06[uVar31] = auVar60._0_8_;
                  local_1c8 = auVar62._0_8_;
                  uStack_1c0 = auVar62._8_8_;
                  ptr_07[uVar31] = local_1c8;
                  ptr_08[uVar31] = auVar66._0_8_;
                  local_268._8_8_ = local_268._8_8_ + 1;
                  local_268._0_8_ = local_268._0_8_ + 1;
                  uVar31 = uVar31 + 1;
                  auVar70 = auVar53;
                  uStack_220 = uVar41;
                  lVar16 = auVar74._0_8_;
                  lVar24 = iVar6;
                  lVar14 = auVar71._0_8_;
                  lVar15 = iVar7;
                  lVar44 = lVar42;
                  iVar58 = lVar5;
                } while (s2Len + 1 != uVar31);
                auVar47._0_8_ = auVar47._0_8_ + 2;
                auVar47._8_8_ = lVar50 + 2;
                uStack_130 = (ulong)(uint)(gap * 2);
                local_288._8_8_ = local_288._8_8_ - uStack_130;
                local_288._0_8_ = local_288._0_8_ - (ulong)(uint)(gap * 2);
                local_2f8 = local_2f8 + uVar20 * 8;
                local_300 = local_300 + uVar20 * 8;
                uVar22 = uVar2;
              } while (uVar2 < uVar27);
            }
            iVar21 = 1;
            uVar20 = uVar17;
            uVar27 = uVar17;
            uVar13 = uVar17;
            do {
              uVar56 = local_218._0_8_;
              uVar23 = local_208._0_8_;
              uVar22 = local_1f8._0_8_;
              if ((long)uVar27 < (long)auVar73._8_8_) {
                uVar17 = local_208._8_8_;
                uVar20 = local_1f8._8_8_;
                uVar27 = auVar73._8_8_;
                uVar13 = local_218._8_8_;
              }
              iVar32 = (int)uVar13;
              iVar28 = (int)uVar17;
              iVar18 = (int)uVar20;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = auVar73._0_8_;
              auVar73 = auVar64 << 0x40;
              iVar21 = iVar21 + -1;
              local_1f8._0_8_ = 0;
              local_1f8._8_8_ = uVar22;
              local_208._0_8_ = 0;
              local_208._8_8_ = uVar23;
              local_218._0_8_ = 0;
              local_218._8_8_ = uVar56;
            } while (iVar21 == 0);
            auVar73._8_8_ = -(ulong)((long)local_1b8._8_8_ <= (long)uVar34);
            auVar73._0_8_ = -(ulong)((long)local_1b8._0_8_ <= (long)uVar34);
            auVar59._8_8_ = -(ulong)(lVar12 < (long)local_238._8_8_);
            auVar59._0_8_ = -(ulong)(lVar12 < (long)local_238._0_8_);
            auVar59 = auVar59 | auVar73;
            if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
              uVar9 = 0;
              iVar10 = 0;
              uVar27 = 0;
              iVar18 = 0;
              iVar28 = 0;
              iVar32 = 0;
            }
            ppVar11->score = (int)uVar27;
            ppVar11->end_query = uVar9;
            ppVar11->end_ref = iVar10;
            ((ppVar11->field_4).stats)->matches = iVar18;
            ((ppVar11->field_4).stats)->similar = iVar28;
            ((ppVar11->field_4).stats)->length = iVar32;
            parasail_free(ptr_08);
            parasail_free(ptr_07);
            parasail_free(ptr_06);
            parasail_free(ptr_05);
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar11;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}